

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

int duckdb_fmt::v6::internal::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  uint64_t uVar11;
  char cVar12;
  int iVar13;
  result rVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  long lVar18;
  size_t __len;
  ulong uVar19;
  uint64_t uVar20;
  ulong uVar21;
  uint64_t error;
  ulong uVar22;
  boundaries bVar23;
  fp fVar24;
  fp fVar25;
  fp value_00;
  ulong uStackY_b0;
  int local_98;
  int cached_exp10;
  uint64_t local_90;
  buffer<char> *local_88;
  ulong local_80;
  fp local_78;
  int local_64;
  fixed_handler handler;
  
  uVar21 = (ulong)specs & 0xff00000000;
  if (value <= (longdouble)0) {
    if (0 < precision && uVar21 == 0x200000000) {
      buffer<char>::resize(buf,(ulong)(uint)precision);
      switchD_004a0b15::default(buf->ptr_,0x30,(ulong)(uint)precision);
      return -precision;
    }
    handler.buf = (char *)CONCAT71(handler.buf._1_7_,0x30);
    buffer<char>::push_back(buf,(char *)&handler);
    return 0;
  }
  if ((specs._4_4_ >> 0x1c & 1) == 0) {
    iVar13 = snprintf_float<long_double>(value,precision,specs,buf);
    return iVar13;
  }
  local_98 = 0;
  cached_exp10 = 0;
  if (precision == -1) {
    local_78.f = 0;
    local_78.e = 0;
    if ((specs._4_4_ >> 0x1b & 1) == 0) {
      local_88 = buf;
      bVar23 = fp::assign_with_boundaries<long_double>(&local_78,value);
    }
    else {
      local_88 = buf;
      bVar23 = fp::assign_float_with_boundaries<long_double>(&local_78,value);
    }
    value_00._8_8_ = bVar23.upper;
    value_00.f = (ulong)(uint)local_78.e;
    fVar24 = normalize<0>((internal *)local_78.f,value_00);
    fVar25 = get_cached_power(-0x7c - fVar24.e,&cached_exp10);
    uVar21 = fVar25.f;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar21;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = fVar24.f;
    local_78.f = SUB168(auVar3 * auVar7,8) - (SUB168(auVar3 * auVar7,0) >> 0x3f);
    cVar12 = (char)fVar24.e + (char)fVar25.e;
    local_78.e = fVar24.e + fVar25.e + 0x40;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar21;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = bVar23.lower;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar21;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = value_00._8_8_;
    lVar18 = SUB168(auVar5 * auVar9,8);
    lVar17 = -(SUB168(auVar5 * auVar9,0) >> 0x3f);
    uVar19 = lVar18 + lVar17 + 1;
    handler.buf = local_88->ptr_;
    handler.size = 0;
    handler._16_8_ = uVar19 - local_78.f;
    bVar15 = -cVar12 - 0x40;
    bVar16 = -cVar12;
    uVar20 = 1L << (bVar16 & 0x3f);
    uVar21 = uVar19 >> (bVar16 & 0x3f);
    error = ((SUB168(auVar4 * auVar8,0) >> 0x3f) - SUB168(auVar4 * auVar8,8)) + lVar18 + lVar17 + 2;
    local_90 = uVar20 - 1;
    uVar19 = uVar19 & local_90;
    local_98 = count_digits((uint32_t)uVar21);
    do {
      iVar13 = local_98 + -1;
      switch(iVar13) {
      case 0:
        cVar12 = (char)uVar21;
        uVar21 = 0;
        goto LAB_00e82d0d;
      case 1:
        uStackY_b0 = 10;
        break;
      case 2:
        uStackY_b0 = 100;
        break;
      case 3:
        uStackY_b0 = 1000;
        break;
      case 4:
        uStackY_b0 = 10000;
        break;
      case 5:
        uStackY_b0 = 100000;
        break;
      case 6:
        uStackY_b0 = 1000000;
        break;
      case 7:
        uStackY_b0 = 10000000;
        break;
      case 8:
        uStackY_b0 = 100000000;
        break;
      case 9:
        uStackY_b0 = 1000000000;
        break;
      default:
        cVar12 = '\0';
        goto LAB_00e82d0d;
      }
      cVar12 = (char)((uVar21 & 0xffffffff) / uStackY_b0);
      uVar21 = (uVar21 & 0xffffffff) % uStackY_b0;
LAB_00e82d0d:
      lVar17 = (long)local_98;
      local_98 = iVar13;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,cVar12 + '0',
                          *(long *)("error " + lVar17 * 8 + 5) << (bVar15 & 0x3f),
                          ((uVar21 & 0xffffffff) << (bVar15 & 0x3f)) + uVar19,error,iVar13,true);
      uVar11 = local_90;
      if (rVar14 != more) goto LAB_00e82da8;
    } while (0 < local_98);
    do {
      uVar21 = uVar19 * 10;
      error = error * 10;
      uVar19 = uVar21 & uVar11;
      local_98 = local_98 + -1;
      rVar14 = grisu_shortest_handler::on_digit
                         ((grisu_shortest_handler *)&handler,(char)(uVar21 >> (bVar15 & 0x3f)) + '0'
                          ,uVar20,uVar19,error,local_98,false);
    } while (rVar14 == more);
LAB_00e82da8:
    if (rVar14 == error) {
      local_98 = local_98 + ~cached_exp10 + handler.size;
      fallback_format<long_double>(value,local_88,&local_98);
      return local_98;
    }
    buffer<char>::resize(local_88,(ulong)(uint)handler.size);
    local_64 = cached_exp10;
LAB_00e82e3a:
    local_98 = local_98 - local_64;
  }
  else {
    if (precision < 0x12) {
      auVar10._8_8_ = 0;
      auVar10._0_8_ = buf;
      fVar24 = normalize<0>((internal *)0x0,(fp)(auVar10 << 0x40));
      local_90 = CONCAT44(local_90._4_4_,fVar24.e);
      fVar25 = get_cached_power(-0x7c - fVar24.e,&cached_exp10);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = fVar25.f;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = fVar24.f;
      handler.buf = buf->ptr_;
      handler.size = 0;
      uVar22 = SUB168(auVar2 * auVar6,8) - (SUB168(auVar2 * auVar6,0) >> 0x3f);
      local_90._0_4_ = fVar25.e + (int)local_90;
      local_64 = cached_exp10;
      handler.fixed = uVar21 == 0x200000000;
      handler.exp10 = -cached_exp10;
      local_80 = CONCAT44(local_80._4_4_,(int)local_90);
      bVar15 = -(char)(int)local_90;
      local_90 = 1L << (bVar15 & 0x3f);
      uVar19 = uVar22 >> (bVar15 & 0x3f);
      local_88 = buf;
      handler.precision = precision;
      local_98 = count_digits((uint32_t)uVar19);
      rVar14 = fixed_handler::on_start
                         (&handler,*(long *)("error " + (long)local_98 * 8 + 5) << (bVar15 & 0x3f),
                          uVar22 / 10,10,&local_98);
      if (rVar14 == more) {
        bVar15 = -(char)local_80 - 0x40;
        local_80 = local_90 - 1;
        uVar22 = uVar22 & local_80;
        uVar20 = 1;
        do {
          iVar13 = local_98 + -1;
          switch(iVar13) {
          case 0:
            cVar12 = (char)uVar19;
            uVar19 = 0;
            goto LAB_00e82ae2;
          case 1:
            uStackY_b0 = 10;
            break;
          case 2:
            uStackY_b0 = 100;
            break;
          case 3:
            uStackY_b0 = 1000;
            break;
          case 4:
            uStackY_b0 = 10000;
            break;
          case 5:
            uStackY_b0 = 100000;
            break;
          case 6:
            uStackY_b0 = 1000000;
            break;
          case 7:
            uStackY_b0 = 10000000;
            break;
          case 8:
            uStackY_b0 = 100000000;
            break;
          case 9:
            uStackY_b0 = 1000000000;
            break;
          default:
            cVar12 = '\0';
            goto LAB_00e82ae2;
          }
          cVar12 = (char)((uVar19 & 0xffffffff) / uStackY_b0);
          uVar19 = (uVar19 & 0xffffffff) % uStackY_b0;
LAB_00e82ae2:
          lVar17 = (long)local_98;
          local_98 = iVar13;
          rVar14 = fixed_handler::on_digit
                             (&handler,cVar12 + '0',
                              *(long *)("error " + lVar17 * 8 + 5) << (bVar15 & 0x3f),
                              ((uVar19 & 0xffffffff) << (bVar15 & 0x3f)) + uVar22,1,iVar13,true);
          if (rVar14 != more) goto LAB_00e82b87;
        } while (0 < local_98);
        do {
          uVar19 = uVar22 * 10;
          uVar20 = uVar20 * 10;
          uVar22 = uVar19 & local_80;
          local_98 = local_98 + -1;
          rVar14 = fixed_handler::on_digit
                             (&handler,(char)(uVar19 >> (bVar15 & 0x3f)) + '0',local_90,uVar22,
                              uVar20,local_98,false);
        } while (rVar14 == more);
      }
LAB_00e82b87:
      buf = local_88;
      if (rVar14 != error) {
        uVar19 = (ulong)(uint)handler.size;
        if (0 < handler.size && uVar21 != 0x200000000) {
          uVar19 = (ulong)(uint)handler.size;
          do {
            iVar13 = local_98 + 1;
            if (local_88->ptr_[uVar19 - 1] != '0') goto LAB_00e82e2c;
            bVar1 = 1 < uVar19;
            uVar19 = uVar19 - 1;
            local_98 = iVar13;
          } while (bVar1);
          uVar19 = 0;
        }
LAB_00e82e2c:
        buffer<char>::resize(local_88,uVar19 & 0xffffffff);
        goto LAB_00e82e3a;
      }
    }
    local_98 = snprintf_float<long_double>(value,precision,specs,buf);
  }
  return local_98;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>(), "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  if (precision != -1) {
    if (precision > 17) return snprintf_float(value, precision, specs, buf);
    fp normalized = normalize(fp(value));
    const auto cached_pow = get_cached_power(
        min_exp - (normalized.e + fp::significand_size), cached_exp10);
    normalized = normalized * cached_pow;
    fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
    if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error)
      return snprintf_float(value, precision, specs, buf);
    int num_digits = handler.size;
    if (!fixed) {
      // Remove trailing zeros.
      while (num_digits > 0 && buf[num_digits - 1] == '0') {
        --num_digits;
        ++exp;
      }
    }
    buf.resize(to_unsigned(num_digits));
  } else {
    fp fp_value;
    auto boundaries = specs.binary32
                          ? fp_value.assign_float_with_boundaries(value)
                          : fp_value.assign_with_boundaries(value);
    fp_value = normalize(fp_value);
    // Find a cached power of 10 such that multiplying value by it will bring
    // the exponent in the range [min_exp, -32].
    const fp cached_pow = get_cached_power(
        min_exp - (fp_value.e + fp::significand_size), cached_exp10);
    // Multiply value and boundaries by the cached power of 10.
    fp_value = fp_value * cached_pow;
    boundaries.lower = multiply(boundaries.lower, cached_pow.f);
    boundaries.upper = multiply(boundaries.upper, cached_pow.f);
    assert(min_exp <= fp_value.e && fp_value.e <= -32);
    --boundaries.lower;  // \tilde{M}^- - 1 ulp -> M^-_{\downarrow}.
    ++boundaries.upper;  // \tilde{M}^+ + 1 ulp -> M^+_{\uparrow}.
    // Numbers outside of (lower, upper) definitely do not round to value.
    grisu_shortest_handler handler{buf.data(), 0,
                                   boundaries.upper - fp_value.f};
    auto result =
        grisu_gen_digits(fp(boundaries.upper, fp_value.e),
                         boundaries.upper - boundaries.lower, exp, handler);
    if (result == digits::error) {
      exp += handler.size - cached_exp10 - 1;
      fallback_format(value, buf, exp);
      return exp;
    }
    buf.resize(to_unsigned(handler.size));
  }
  return exp - cached_exp10;
}